

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  int *piVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  xmlDocPtr doc;
  xmlChar *pxVar4;
  _xmlSAXHandler *p_Var5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  uint uVar8;
  xmlChar *value;
  int iVar9;
  int *piVar10;
  _xmlNode *p_Var11;
  int nbNs;
  xmlChar *URI;
  xmlChar *prefix;
  undefined8 in_stack_ffffffffffffff68;
  int local_74;
  xmlChar *local_70;
  xmlChar *local_68;
  _xmlNode *local_60;
  xmlParserNodeInfo local_58;
  
  iVar9 = 0x800;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    iVar9 = 0x100;
  }
  local_68 = (xmlChar *)0x0;
  local_70 = (xmlChar *)0x0;
  local_74 = 0;
  iVar2 = ctxt->nameNr;
  if (iVar9 < iVar2) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,iVar2,
               "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
               CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),iVar2));
    xmlHaltParser(ctxt);
    iVar9 = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      pxVar3 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar3->cur + (pxVar3->consumed - (long)pxVar3->base));
      local_58.begin_line = (unsigned_long)pxVar3->line;
    }
    if (ctxt->spaceNr == 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = -1;
      if (*ctxt->space != -2) {
        iVar9 = *ctxt->space;
      }
    }
    spacePush(ctxt,iVar9);
    iVar9 = ctxt->input->line;
    if (ctxt->sax2 == 0) {
      value = xmlParseStartTag(ctxt);
    }
    else {
      value = xmlParseStartTag2(ctxt,&local_68,&local_70,&local_74);
    }
    pxVar7 = local_68;
    pxVar6 = local_70;
    iVar2 = local_74;
    if (value == (xmlChar *)0x0) {
      iVar2 = ctxt->spaceNr;
      iVar9 = -1;
      if (0 < (long)iVar2) {
        ctxt->spaceNr = iVar2 + -1;
        piVar1 = ctxt->spaceTab + (long)iVar2 + -2;
        piVar10 = ctxt->spaceTab;
        if (iVar2 != 1) {
          piVar10 = piVar1;
        }
        ctxt->space = piVar10;
        piVar1[1] = -1;
      }
    }
    else {
      nameNsPush(ctxt,value,local_68,local_70,iVar9,local_74);
      p_Var11 = ctxt->node;
      if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
          (doc = ctxt->myDoc, p_Var11 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
         (p_Var11 == doc->children)) {
        local_60 = p_Var11;
        uVar8 = xmlValidateRoot(&ctxt->vctxt,doc);
        ctxt->valid = ctxt->valid & uVar8;
        p_Var11 = local_60;
      }
      pxVar3 = ctxt->input;
      pxVar4 = pxVar3->cur;
      if (*pxVar4 == '>') {
        pxVar3->col = pxVar3->col + 1;
        pxVar3->cur = pxVar4 + 1;
        if (pxVar4[1] == '\0') {
          xmlParserGrow(ctxt);
        }
        iVar9 = 0;
        if (p_Var11 == (_xmlNode *)0x0) {
          return 0;
        }
        if (ctxt->record_info == 0) {
          return 0;
        }
        local_58.end_pos = 0;
        local_58.end_line = 0;
      }
      else {
        if ((*pxVar4 != '/') || (pxVar4[1] != '>')) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_GT_REQUIRED,XML_ERR_FATAL,value,
                     (xmlChar *)0x0,(xmlChar *)0x0,iVar9,
                     "Couldn\'t find end of Start Tag %s line %d\n",value,iVar9,0);
          nodePop(ctxt);
          namePop(ctxt);
          iVar9 = ctxt->spaceNr;
          if (0 < (long)iVar9) {
            ctxt->spaceNr = iVar9 + -1;
            piVar1 = ctxt->spaceTab + (long)iVar9 + -2;
            piVar10 = ctxt->spaceTab;
            if (iVar9 != 1) {
              piVar10 = piVar1;
            }
            ctxt->space = piVar10;
            piVar1[1] = -1;
          }
          if (iVar2 < 1) {
            return -1;
          }
          xmlParserNsPop(ctxt,iVar2);
          return -1;
        }
        pxVar3->cur = pxVar4 + 2;
        pxVar3->col = pxVar3->col + 2;
        if (pxVar4[2] == '\0') {
          xmlParserGrow(ctxt);
        }
        p_Var5 = ctxt->sax;
        if (ctxt->sax2 == 0) {
          if (((p_Var5 != (_xmlSAXHandler *)0x0) && (p_Var5->endElement != (endElementSAXFunc)0x0))
             && (ctxt->disableSAX == 0)) {
            (*p_Var5->endElement)(ctxt->userData,value);
          }
        }
        else if (((p_Var5 != (_xmlSAXHandler *)0x0) &&
                 (p_Var5->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)) {
          (*p_Var5->endElementNs)(ctxt->userData,value,pxVar7,pxVar6);
        }
        namePop(ctxt);
        iVar9 = ctxt->spaceNr;
        if (0 < (long)iVar9) {
          ctxt->spaceNr = iVar9 + -1;
          piVar1 = ctxt->spaceTab + (long)iVar9 + -2;
          piVar10 = ctxt->spaceTab;
          if (iVar9 != 1) {
            piVar10 = piVar1;
          }
          ctxt->space = piVar10;
          piVar1[1] = -1;
        }
        if (0 < iVar2) {
          xmlParserNsPop(ctxt,iVar2);
        }
        iVar9 = 1;
        if (p_Var11 == (_xmlNode *)0x0) {
          return 1;
        }
        if (ctxt->record_info == 0) {
          return 1;
        }
        pxVar3 = ctxt->input;
        local_58.end_pos = (unsigned_long)(pxVar3->cur + (pxVar3->consumed - (long)pxVar3->base));
        local_58.end_line = (unsigned_long)pxVar3->line;
      }
      local_58.node = p_Var11;
      xmlParserAddNodeInfo(ctxt,&local_58);
    }
  }
  return iVar9;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line;
    xmlNodePtr cur;
    int nbNs = 0;

    if (ctxt->nameNr > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                ctxt->nameNr);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &nbNs);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, nbNs);
    cur = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = ctxt->input->consumed +
                                (CUR_PTR - ctxt->input->base);
            node_info.end_line = ctxt->input->line;
            xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
        if (cur != NULL && ctxt->record_info) {
            node_info.node = cur;
            node_info.end_pos = 0;
            node_info.end_line = 0;
            xmlParserAddNodeInfo(ctxt, &node_info);
        }
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nbNs > 0)
	    xmlParserNsPop(ctxt, nbNs);
	return(-1);
    }

    return(0);
}